

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_math.cpp
# Opt level: O0

double crnlib::math::compute_entropy(uint8 *p,uint n)

{
  double dVar1;
  double dVar2;
  double prob;
  uint i_1;
  double invln2;
  double entropy;
  uint local_418;
  uint i;
  uint hist [256];
  byte *pbStack_10;
  uint n_local;
  uint8 *p_local;
  
  hist[0xff] = n;
  utils::zero_object<unsigned_int[256]>((uint (*) [256])&local_418);
  pbStack_10 = p;
  for (entropy._4_4_ = 0; entropy._4_4_ < hist[0xff]; entropy._4_4_ = entropy._4_4_ + 1) {
    (&local_418)[*pbStack_10] = (&local_418)[*pbStack_10] + 1;
    pbStack_10 = pbStack_10 + 1;
  }
  invln2 = 0.0;
  dVar1 = std::log(5.30498947741318e-315);
  for (prob._4_4_ = 0; prob._4_4_ < 0x100; prob._4_4_ = prob._4_4_ + 1) {
    if ((&local_418)[prob._4_4_] != 0) {
      dVar2 = log((double)(&local_418)[prob._4_4_] / (double)hist[0xff]);
      invln2 = -dVar2 * (double)(1.0 / SUB84(dVar1,0)) * (double)(&local_418)[prob._4_4_] + invln2;
    }
  }
  return invln2;
}

Assistant:

double compute_entropy(const uint8* p, uint n)
        {
            uint hist[256];
            utils::zero_object(hist);

            for (uint i = 0; i < n; i++)
            {
                hist[*p++]++;
            }

            double entropy = 0.0f;

            const double invln2 = 1.0f / log(2.0f);
            for (uint i = 0; i < 256; i++)
            {
                if (!hist[i])
                {
                    continue;
                }

                double prob = static_cast<double>(hist[i]) / n;
                entropy += (-log(prob) * invln2) * hist[i];
            }

            return entropy;
        }